

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int fsg_model_free(fsg_model_t *fsg)

{
  int iVar1;
  int local_1c;
  int i;
  fsg_model_t *fsg_local;
  
  if (fsg == (fsg_model_t *)0x0) {
    fsg_local._4_4_ = 0;
  }
  else {
    iVar1 = fsg->refcount + -1;
    fsg->refcount = iVar1;
    if (iVar1 < 1) {
      for (local_1c = 0; local_1c < fsg->n_word; local_1c = local_1c + 1) {
        ckd_free(fsg->vocab[local_1c]);
      }
      for (local_1c = 0; local_1c < fsg->n_state; local_1c = local_1c + 1) {
        trans_list_free(fsg,local_1c);
      }
      ckd_free(fsg->trans);
      ckd_free(fsg->vocab);
      listelem_alloc_free(fsg->link_alloc);
      ckd_free(fsg->silwords);
      ckd_free(fsg->altwords);
      ckd_free(fsg->name);
      ckd_free(fsg);
      fsg_local._4_4_ = 0;
    }
    else {
      fsg_local._4_4_ = fsg->refcount;
    }
  }
  return fsg_local._4_4_;
}

Assistant:

int
fsg_model_free(fsg_model_t * fsg)
{
    int i;

    if (fsg == NULL)
        return 0;

    if (--fsg->refcount > 0)
        return fsg->refcount;

    for (i = 0; i < fsg->n_word; ++i)
        ckd_free(fsg->vocab[i]);
    for (i = 0; i < fsg->n_state; ++i)
        trans_list_free(fsg, i);
    ckd_free(fsg->trans);
    ckd_free(fsg->vocab);
    listelem_alloc_free(fsg->link_alloc);
    bitvec_free(fsg->silwords);
    bitvec_free(fsg->altwords);
    ckd_free(fsg->name);
    ckd_free(fsg);
    return 0;
}